

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O2

void __thiscall floorplan::GraphStatistics::calculateAverageClusterCoeffient(GraphStatistics *this)

{
  pointer paVar1;
  ulong uVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long lVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  int local_21c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream strs;
  float local_1a8 [94];
  
  this->_averageClusterCoefficient = 0.0;
  lVar4 = 0;
  uVar5 = 0;
  local_21c = 0;
  do {
    paVar1 = (this->_database->_graphs).
             super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->_database->_graphs).
                   super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x38;
    if (uVar2 <= uVar5) {
      lVar4 = uVar2 - (long)local_21c;
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      this->_averageClusterCoefficient =
           this->_averageClusterCoefficient /
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      return;
    }
    GraphUtils::calculateClusterCoeff
              ((pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_float>
                *)&strs,(floorplanGraph *)((long)&paVar1->super_type + lVar4));
    if (NAN(local_1a8[0])) {
      local_21c = local_21c + 1;
    }
    else {
      dVar6 = (double)local_1a8[0];
      if ((dVar6 <= 0.4) ||
         (*(ulong *)((long)&((this->_database->_graphs).
                             super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar4 + 0x28)
          < 0x15)) {
        if ((local_1a8[0] == 0.0) &&
           ((!NAN(local_1a8[0]) &&
            (0x14 < *(ulong *)((long)&((this->_database->_graphs).
                                       super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_type +
                              lVar4 + 0x28))))) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Low!");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::ostream::_M_insert<double>(dVar6);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::stringstream::stringstream((stringstream *)&strs);
          std::ostream::operator<<((ostream *)local_1a8,(int)uVar5);
          std::__cxx11::stringbuf::str();
          __return_storage_ptr__ = &local_1f8;
          std::operator+(__return_storage_ptr__,"low_",&local_218);
          GraphFileOperations::saveGraphToPNG
                    (__return_storage_ptr__,
                     (floorplanGraph *)
                     ((long)&((this->_database->_graphs).
                              super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar4));
          goto LAB_0015bb76;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"High!");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::ostream::_M_insert<double>(dVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringstream::stringstream((stringstream *)&strs);
        std::ostream::operator<<((ostream *)local_1a8,(int)uVar5);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__ = &local_1d8;
        std::operator+(__return_storage_ptr__,"high_",&local_218);
        GraphFileOperations::saveGraphToPNG
                  (__return_storage_ptr__,
                   (floorplanGraph *)
                   ((long)&((this->_database->_graphs).
                            super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar4));
LAB_0015bb76:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::stringstream::~stringstream((stringstream *)&strs);
      }
      this->_averageClusterCoefficient = this->_averageClusterCoefficient + dVar6;
      poVar3 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar3," total ");
      poVar3 = std::ostream::_M_insert<double>(this->_averageClusterCoefficient);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x38;
  } while( true );
}

Assistant:

void GraphStatistics::calculateAverageClusterCoeffient()//ExportClusterCoeffDistForCategory(string sFilename, string sCategory)
{
    _averageClusterCoefficient = 0.0;
    int nanvalues = 0;

    for(int i=0; i < _database->getGraphs().size(); i++)
    {
        std::pair<ClusteringMap, double> kRes = GraphUtils::calculateClusterCoeff(_database->getGraphs()[i]);
        if (isnan(kRes.second)){
        nanvalues++;
            continue;
        }
        if( kRes.second > 0.4 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "High!" << endl;
            cout << kRes.second << endl;
            stringstream strs;
            strs << i;
            GraphFileOperations::saveGraphToPNG("high_" + strs.str(), _database->getGraphs()[i]);
        }
        else if( kRes.second == 0 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "Low!" << endl;
            cout << kRes.second << endl;
            if(kRes.second == 0){
                stringstream strs;
                strs << i;
                GraphFileOperations::saveGraphToPNG("low_" + strs.str(), _database->getGraphs()[i]);

            }

        }

        _averageClusterCoefficient += kRes.second;
        cout << kRes.second << " total " << _averageClusterCoefficient << endl;
    }
    _averageClusterCoefficient = _averageClusterCoefficient /  ( _database->getGraphs().size() - nanvalues);
}